

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>::
AdapterPromiseNode<kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
          (AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter> *this,ChildSet *params
          ,Maybe<int> *params_1)

{
  ChildSet *childSet;
  Maybe<int> *pidRef;
  Maybe<int> *params_local_1;
  ChildSet *params_local;
  AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<int>::PromiseFulfiller((PromiseFulfiller<int> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00c0e8f0;
  *(undefined ***)(this + 0x18) = &PTR_reject_00c0e940;
  ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)(this + 0x20));
  this[0x1c0] = (AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>)0x1;
  childSet = fwd<kj::UnixEventPort::ChildSet&>(params);
  pidRef = fwd<kj::Maybe<int>&>(params_1);
  UnixEventPort::ChildExitPromiseAdapter::ChildExitPromiseAdapter
            ((ChildExitPromiseAdapter *)(this + 0x1c8),(PromiseFulfiller<int> *)(this + 0x18),
             childSet,pidRef);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}